

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

int defineAttribute(ELEMENT_TYPE *type,ATTRIBUTE_ID *attId,int isCdata,int isId,XML_Char *value,
                   XML_Parser parser)

{
  DEFAULT_ATTRIBUTE *pDVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = type->nDefaultAtts;
  if (isId != 0 || value != (XML_Char *)0x0) {
    if (0 < (int)uVar2) {
      lVar3 = 0;
      do {
        if (*(ATTRIBUTE_ID **)((long)&type->defaultAtts->id + lVar3) == attId) {
          return 1;
        }
        lVar3 = lVar3 + 0x18;
      } while ((ulong)uVar2 * 0x18 != lVar3);
    }
    if (((isId != 0) && (type->idAtt == (ATTRIBUTE_ID *)0x0)) && (attId->xmlns == '\0')) {
      type->idAtt = attId;
    }
  }
  if (uVar2 == type->allocDefaultAtts) {
    if (uVar2 == 0) {
      type->allocDefaultAtts = 8;
      pDVar1 = (DEFAULT_ATTRIBUTE *)(**(code **)((long)parser + 0x18))(0xc0);
    }
    else {
      type->allocDefaultAtts = uVar2 * 2;
      pDVar1 = (DEFAULT_ATTRIBUTE *)
               (**(code **)((long)parser + 0x20))(type->defaultAtts,(long)(int)uVar2 * 0x30);
    }
    type->defaultAtts = pDVar1;
    if (pDVar1 == (DEFAULT_ATTRIBUTE *)0x0) {
      return 0;
    }
    uVar2 = type->nDefaultAtts;
  }
  else {
    pDVar1 = type->defaultAtts;
  }
  pDVar1[(int)uVar2].id = attId;
  pDVar1[(int)uVar2].value = value;
  pDVar1[(int)uVar2].isCdata = (char)isCdata;
  if (isCdata == 0) {
    attId->maybeTokenized = '\x01';
  }
  type->nDefaultAtts = uVar2 + 1;
  return 1;
}

Assistant:

static int
defineAttribute(ELEMENT_TYPE *type, ATTRIBUTE_ID *attId, int isCdata,
                int isId, const XML_Char *value, XML_Parser parser)
{
  DEFAULT_ATTRIBUTE *att;
  if (value || isId) {
    /* The handling of default attributes gets messed up if we have
       a default which duplicates a non-default. */
    int i;
    for (i = 0; i < type->nDefaultAtts; i++)
      if (attId == type->defaultAtts[i].id)
        return 1;
    if (isId && !type->idAtt && !attId->xmlns)
      type->idAtt = attId;
  }
  if (type->nDefaultAtts == type->allocDefaultAtts) {
    if (type->allocDefaultAtts == 0) {
      type->allocDefaultAtts = 8;
      type->defaultAtts = MALLOC(type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    else {
      type->allocDefaultAtts *= 2;
      type->defaultAtts = REALLOC(type->defaultAtts,
                                  type->allocDefaultAtts*sizeof(DEFAULT_ATTRIBUTE));
    }
    if (!type->defaultAtts)
      return 0;
  }
  att = type->defaultAtts + type->nDefaultAtts;
  att->id = attId;
  att->value = value;
  att->isCdata = isCdata;
  if (!isCdata)
    attId->maybeTokenized = 1;
  type->nDefaultAtts += 1;
  return 1;
}